

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeData.cpp
# Opt level: O0

string * __thiscall TPZShapeData::ShapeFunctionType_abi_cxx11_(TPZShapeData *this)

{
  allocator<char> *__a;
  long in_RSI;
  string *in_RDI;
  size_t in_stack_000003b8;
  char *in_stack_000003c0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_11 [17];
  
  __a = (allocator<char> *)(ulong)*(uint *)(in_RSI + 8);
  switch(__a) {
  case (allocator<char> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator(local_11);
    break;
  case (allocator<char> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdb);
    break;
  case (allocator<char> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffda);
    break;
  case (allocator<char> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd9);
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"std::string TPZShapeData::ShapeFunctionType() const");
    std::operator<<((ostream *)&std::cerr,"Invalid value\n");
    pzinternal::DebugStopImpl(in_stack_000003c0,in_stack_000003b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd8);
  }
  return in_RDI;
}

Assistant:

std::string TPZShapeData::ShapeFunctionType() const
{
    switch(fShapeType){
        case EEmpty:
            return "NotInitialized";
        case EScalarShape:
            return "Scalar";
        case EVecandShape:
            return "Vector combined with Scalar";
        case EVecShape:
            return "Vector shape";
        default:
            PZError<<__PRETTY_FUNCTION__;
            PZError<<"Invalid value\n";
            DebugStop();
    }
    return "All Wrong!\n";
}